

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O3

ParserResult *
Catch::Clara::Detail::convertInto<double>
          (ParserResult *__return_storage_ptr__,string *source,double *target)

{
  long *plVar1;
  size_type *psVar2;
  stringstream ss;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  long local_1a8 [4];
  byte abStack_188 [96];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8,(string *)source,_S_out|_S_in);
  std::istream::_M_extract<double>((double *)local_1a8);
  if ((abStack_188[*(long *)(local_1a8[0] + -0x18)] & 5) == 0) {
    *(undefined8 *)
     &(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
      super_ResultBase.m_type = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001fc090;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  }
  else {
    std::operator+(&local_1c8,"Unable to convert \'",source);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    psVar2 = (size_type *)(plVar1 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar1 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar2) {
      local_1e8.field_2._M_allocated_capacity = *psVar2;
      local_1e8.field_2._8_8_ = plVar1[3];
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar2;
      local_1e8._M_dataplus._M_p = (pointer)*plVar1;
    }
    local_1e8._M_string_length = plVar1[1];
    *plVar1 = (long)psVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    BasicResult<Catch::Clara::ParseResultType>::BasicResult
              (__return_storage_ptr__,RuntimeError,&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

ParserResult convertInto( std::string const& source, T& target ) {
                std::stringstream ss( source );
                ss >> target;
                if ( ss.fail() ) {
                    return ParserResult::runtimeError(
                        "Unable to convert '" + source +
                        "' to destination type" );
                } else {
                    return ParserResult::ok( ParseResultType::Matched );
                }
            }